

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem02.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
    long sum=2;
    long oo=1;
    long o=2;
    long n=3;
    while (n<=4e6) {
        if (n%2==0) sum+=n;
        oo=o;
        o=n;

        n=o+oo;
    }

    cout<<sum<<endl;
}